

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall t_rb_generator::generate_service_helpers(t_rb_generator *this,t_service *tservice)

{
  bool bVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_rb_ofstream *ptVar2;
  ostream *poVar3;
  reference pptVar4;
  t_struct *tstruct;
  t_struct *ts;
  t_function **local_50;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_38;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_rb_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_38);
  ptVar2 = t_rb_ofstream::indent(&this->f_service_);
  poVar3 = std::operator<<((ostream *)ptVar2,"# HELPER FUNCTIONS AND STRUCTURES");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  local_50 = (t_function **)
             std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                       ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_38._M_current = local_50;
  while( true ) {
    ts = (t_struct *)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&ts);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    tstruct = t_function::get_arglist(*pptVar4);
    generate_rb_struct(this,&this->f_service_,tstruct,false);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    generate_rb_function_helpers(this,*pptVar4);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_rb_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_.indent() << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_rb_struct(f_service_, ts);
    generate_rb_function_helpers(*f_iter);
  }
}